

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.tab.cpp
# Opt level: O3

int yysyntax_error(long *yymsg_alloc,char **yymsg,yypcontext_t *yyctx)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  int in_ECX;
  int iVar4;
  int iVar5;
  char *yyp;
  int yyi;
  long lVar6;
  char *__s;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  yysymbol_kind_t yyarg [5];
  int local_58 [6];
  ulong local_40;
  long *local_38;
  
  uVar10 = 0;
  __s = "syntax error";
  if (in_ECX != -2) {
    iVar4 = (int)yypact[*(short *)&yyctx->yyssp];
    if (iVar4 != -0x7c) {
      iVar7 = -iVar4;
      iVar2 = 0;
      if (-1 < yypact[*(short *)&yyctx->yyssp]) {
        iVar7 = 0;
      }
      iVar5 = 0x39;
      if (0x14d - iVar4 < 0x39) {
        iVar5 = 0x14d - iVar4;
      }
      if (iVar7 < iVar5) {
        lVar6 = (long)iVar7;
        __s = "syntax error, unexpected %s";
        lVar8 = 0;
        do {
          if ((1 - lVar6 != lVar8) && (iVar7 + (int)lVar8 == (int)yycheck[lVar8 + iVar4 + lVar6])) {
            if (iVar2 == 4) {
              uVar10 = 1;
              goto switchD_001257de_caseD_fffffffe;
            }
            lVar9 = (long)iVar2;
            iVar2 = iVar2 + 1;
            local_58[lVar9 + 1] = (int)yycheck[lVar8 + iVar4 + lVar6];
          }
          lVar8 = lVar8 + 1;
        } while (iVar5 - lVar6 != lVar8);
        if (iVar2 == -2) {
          return -2;
        }
        if (iVar2 != 0) {
          uVar10 = (ulong)(iVar2 + 1);
          __s = "syntax error";
          switch(iVar2) {
          case 1:
            __s = "syntax error, unexpected %s, expecting %s";
            uVar10 = 2;
            break;
          case 2:
            __s = "syntax error, unexpected %s, expecting %s or %s";
            uVar10 = 3;
            break;
          case 3:
            __s = "syntax error, unexpected %s, expecting %s or %s or %s";
            uVar10 = 4;
            break;
          case 4:
            __s = "syntax error, unexpected %s, expecting %s or %s or %s or %s";
            uVar10 = 5;
            break;
          case -3:
            return -2;
          }
          goto switchD_001257de_caseD_fffffffe;
        }
      }
    }
    local_58[1] = 0xfffffffe;
    uVar10 = 1;
    __s = "syntax error, unexpected %s";
  }
switchD_001257de_caseD_fffffffe:
  local_38 = yymsg_alloc;
  sVar3 = strlen(__s);
  lVar6 = (sVar3 - (long)((int)uVar10 * 2)) + 1;
  local_40 = uVar10;
  if (0 < (int)uVar10) {
    uVar11 = 0;
    do {
      lVar8 = yytnamerr((char *)0x0,yytname[local_58[uVar11]]);
      if (lVar8 < 0) {
        return -2;
      }
      lVar6 = lVar6 + lVar8;
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  uVar10 = local_40;
  if (lVar6 <= *local_38) {
    iVar4 = 0;
    do {
      cVar1 = *__s;
      *(char *)yymsg = cVar1;
      lVar6 = 1;
      if (cVar1 == '%') {
        if ((__s[1] == 's') && (iVar4 < (int)uVar10)) {
          lVar6 = (long)iVar4;
          iVar4 = iVar4 + 1;
          lVar6 = yytnamerr((char *)yymsg,yytname[local_58[lVar6]]);
          lVar8 = 2;
        }
        else {
          lVar8 = 1;
        }
      }
      else {
        lVar8 = 1;
        if (cVar1 == '\0') {
          return 0;
        }
      }
      yymsg = (char **)((long)yymsg + lVar6);
      __s = __s + lVar8;
    } while( true );
  }
  lVar8 = lVar6 * 2;
  lVar9 = 0x7fffffffffffffff;
  if (lVar6 == lVar8 || SBORROW8(lVar6,lVar8) != 0 < lVar6) {
    lVar9 = lVar8;
  }
  *local_38 = lVar9;
  return -1;
}

Assistant:

static int
yysyntax_error (YYPTRDIFF_T *yymsg_alloc, char **yymsg,
                const yypcontext_t *yyctx)
{
  enum { YYARGS_MAX = 5 };
  /* Internationalized format string. */
  const char *yyformat = YY_NULLPTR;
  /* Arguments of yyformat: reported tokens (one for the "unexpected",
     one per "expected"). */
  yysymbol_kind_t yyarg[YYARGS_MAX];
  /* Cumulated lengths of YYARG.  */
  YYPTRDIFF_T yysize = 0;

  /* Actual size of YYARG. */
  int yycount = yy_syntax_error_arguments (yyctx, yyarg, YYARGS_MAX);
  if (yycount == YYENOMEM)
    return YYENOMEM;

  switch (yycount)
    {
#define YYCASE_(N, S)                       \
      case N:                               \
        yyformat = S;                       \
        break
    default: /* Avoid compiler warnings. */
      YYCASE_(0, YY_("syntax error"));
      YYCASE_(1, YY_("syntax error, unexpected %s"));
      YYCASE_(2, YY_("syntax error, unexpected %s, expecting %s"));
      YYCASE_(3, YY_("syntax error, unexpected %s, expecting %s or %s"));
      YYCASE_(4, YY_("syntax error, unexpected %s, expecting %s or %s or %s"));
      YYCASE_(5, YY_("syntax error, unexpected %s, expecting %s or %s or %s or %s"));
#undef YYCASE_
    }

  /* Compute error message size.  Don't count the "%s"s, but reserve
     room for the terminator.  */
  yysize = yystrlen (yyformat) - 2 * yycount + 1;
  {
    int yyi;
    for (yyi = 0; yyi < yycount; ++yyi)
      {
        YYPTRDIFF_T yysize1
          = yysize + yytnamerr (YY_NULLPTR, yytname[yyarg[yyi]]);
        if (yysize <= yysize1 && yysize1 <= YYSTACK_ALLOC_MAXIMUM)
          yysize = yysize1;
        else
          return YYENOMEM;
      }
  }

  if (*yymsg_alloc < yysize)
    {
      *yymsg_alloc = 2 * yysize;
      if (! (yysize <= *yymsg_alloc
             && *yymsg_alloc <= YYSTACK_ALLOC_MAXIMUM))
        *yymsg_alloc = YYSTACK_ALLOC_MAXIMUM;
      return -1;
    }

  /* Avoid sprintf, as that infringes on the user's name space.
     Don't have undefined behavior even if the translation
     produced a string with the wrong number of "%s"s.  */
  {
    char *yyp = *yymsg;
    int yyi = 0;
    while ((*yyp = *yyformat) != '\0')
      if (*yyp == '%' && yyformat[1] == 's' && yyi < yycount)
        {
          yyp += yytnamerr (yyp, yytname[yyarg[yyi++]]);
          yyformat += 2;
        }
      else
        {
          ++yyp;
          ++yyformat;
        }
  }
  return 0;
}